

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageQueryLevelsOrSamples
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  DiagnosticStream *pDVar4;
  spv_const_context psVar5;
  DiagnosticStream local_d60;
  DiagnosticStream local_b88;
  string local_9b0;
  DiagnosticStream local_990;
  spv_target_env local_7b4;
  undefined1 local_7b0 [4];
  spv_target_env target_env;
  Op local_5d4;
  undefined1 local_5d0 [4];
  Op opcode;
  undefined1 local_3f8 [8];
  ImageTypeInfo info;
  undefined1 local_1f8 [4];
  uint32_t image_type;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  uVar2 = val::Instruction::type_id(inst);
  bVar1 = ValidationState_t::IsIntScalarType(_,uVar2);
  if (bVar1) {
    uVar2 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,local_20,2);
    OVar3 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,uVar2);
    if (OVar3 == OpTypeImage) {
      ImageTypeInfo::ImageTypeInfo((ImageTypeInfo *)local_3f8);
      bVar1 = GetImageTypeInfo((ValidationState_t *)inst_local,uVar2,(ImageTypeInfo *)local_3f8);
      if (bVar1) {
        local_5d4 = val::Instruction::opcode(local_20);
        if (local_5d4 == OpImageQueryLevels) {
          if ((((local_3f8._4_4_ != Dim1D) && (local_3f8._4_4_ != Dim2D)) &&
              (local_3f8._4_4_ != Dim3D)) && (local_3f8._4_4_ != Cube)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_7b0,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,local_20);
            pDVar4 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)local_7b0,
                                (char (*) [39])"Image \'Dim\' must be 1D, 2D, 3D or Cube");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_7b0);
            return __local._4_4_;
          }
          psVar5 = ValidationState_t::context((ValidationState_t *)inst_local);
          local_7b4 = psVar5->target_env;
          bVar1 = spvIsVulkanEnv(local_7b4);
          if ((bVar1) && (info.arrayed != 1)) {
            ValidationState_t::diag
                      (&local_990,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,local_20);
            ValidationState_t::VkErrorID_abi_cxx11_
                      (&local_9b0,(ValidationState_t *)inst_local,0x1233,(char *)0x0);
            pDVar4 = DiagnosticStream::operator<<(&local_990,&local_9b0);
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(char (*) [102])
                                       "OpImageQueryLevels must only consume an \"Image\" operand whose type has its \"Sampled\" operand set to 1"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            std::__cxx11::string::~string((string *)&local_9b0);
            DiagnosticStream::~DiagnosticStream(&local_990);
            return __local._4_4_;
          }
        }
        else {
          if (local_5d4 != OpImageQuerySamples) {
            __assert_fail("opcode == spv::Op::OpImageQuerySamples",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                          ,0x87c,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageQueryLevelsOrSamples(ValidationState_t &, const Instruction *)"
                         );
          }
          if (local_3f8._4_4_ != Dim2D) {
            ValidationState_t::diag
                      (&local_b88,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,local_20);
            pDVar4 = DiagnosticStream::operator<<
                               (&local_b88,(char (*) [23])"Image \'Dim\' must be 2D");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_b88);
            return __local._4_4_;
          }
          if (info.depth != 1) {
            ValidationState_t::diag
                      (&local_d60,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,local_20);
            pDVar4 = DiagnosticStream::operator<<
                               (&local_d60,(char (*) [21])"Image \'MS\' must be 1");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_d60);
            return __local._4_4_;
          }
        }
        __local._4_4_ = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_5d0,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,local_20);
        pDVar4 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_5d0,
                            (char (*) [30])"Corrupt image type definition");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5d0);
      }
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)&info.format,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,local_20);
      pDVar4 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&info.format,
                          (char (*) [41])"Expected Image to be of type OpTypeImage");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&info.format);
    }
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               local_20);
    pDVar4 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_1f8,
                        (char (*) [43])"Expected Result Type to be int scalar type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateImageQueryLevelsOrSamples(ValidationState_t& _,
                                               const Instruction* inst) {
  if (!_.IsIntScalarType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type to be int scalar type";
  }

  const uint32_t image_type = _.GetOperandTypeId(inst, 2);
  if (_.GetIdOpcode(image_type) != spv::Op::OpTypeImage) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image to be of type OpTypeImage";
  }

  ImageTypeInfo info;
  if (!GetImageTypeInfo(_, image_type, &info)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Corrupt image type definition";
  }

  const spv::Op opcode = inst->opcode();
  if (opcode == spv::Op::OpImageQueryLevels) {
    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image 'Dim' must be 1D, 2D, 3D or Cube";
    }
    const auto target_env = _.context()->target_env;
    if (spvIsVulkanEnv(target_env)) {
      if (info.sampled != 1) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(4659)
               << "OpImageQueryLevels must only consume an \"Image\" operand "
                  "whose type has its \"Sampled\" operand set to 1";
      }
    }
  } else {
    assert(opcode == spv::Op::OpImageQuerySamples);
    if (info.dim != spv::Dim::Dim2D) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst) << "Image 'Dim' must be 2D";
    }

    if (info.multisampled != 1) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst) << "Image 'MS' must be 1";
    }
  }
  return SPV_SUCCESS;
}